

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpComms.cpp
# Opt level: O2

void __thiscall helics::tcp::TcpComms::queue_rx_function(TcpComms *this)

{
  BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *this_00;
  string *address;
  atomic<int> *paVar1;
  int32_t iVar2;
  bool bVar3;
  int iVar4;
  milliseconds timeOut;
  BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *pBVar5;
  string_view message_00;
  string_view message_01;
  pointer server;
  LoopHandle contextLoop;
  shared_ptr<gmlc::networking::AsioContextManager> ioctx;
  undefined1 local_148 [32];
  ActionMessage message;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  this_00 = &this->rxMessageQueue;
  while ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i < 0) {
    gmlc::containers::BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::pop
              (&message,this_00);
    if (((message.messageAction == cmd_protocol_priority) ||
        (message.messageAction == cmd_protocol_big)) || (message.messageAction == cmd_protocol)) {
      if (message.messageID == 0x5ab) {
        NetworkCommsInterface::loadPortDefinitions(&this->super_NetworkCommsInterface,&message);
      }
      else if ((message.messageID == 0x9db) || (message.messageID == 0x16570bf)) {
        LOCK();
        (this->super_NetworkCommsInterface).super_CommsInterface.disconnecting._M_base._M_i = true;
        UNLOCK();
        CommsInterface::setRxStatus((CommsInterface *)this,TERMINATED);
        ActionMessage::~ActionMessage(&message);
        return;
      }
    }
    ActionMessage::~ActionMessage(&message);
  }
  if ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i < 0) {
    CommsInterface::setRxStatus((CommsInterface *)this,ERRORED);
    return;
  }
  message._0_8_ = &message.dest_id;
  message.source_id.gid = 0;
  message.source_handle.hid = 0;
  message.dest_id.gid._0_1_ = 0;
  gmlc::networking::AsioContextManager::getContextPointer
            ((AsioContextManager *)&ioctx,(string *)&message);
  std::__cxx11::string::~string((string *)&message);
  if ((this->super_NetworkCommsInterface).encrypted == true) {
    gmlc::networking::SocketFactory::SocketFactory
              ((SocketFactory *)local_148,&this->encryption_config,true);
  }
  else {
    local_148._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_148._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_148._16_8_ = (pointer)0x0;
  }
  address = &(this->super_NetworkCommsInterface).super_CommsInterface.localTargetAddress;
  timeOut.__r = (rep)local_148;
  gmlc::networking::TcpServer::create
            ((TcpServer *)&server,(SocketFactory *)timeOut.__r,
             ((ioctx.
               super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->ictx)._M_t.
             super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
             super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
             super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl,address,
             (uint16_t)(this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i,
             this->reuse_address,
             (this->super_NetworkCommsInterface).super_CommsInterface.maxMessageSize);
  do {
    while( true ) {
      if ((((server.super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->halted)._M_base._M_i & 1U) == 0) {
        gmlc::networking::AsioContextManager::startContextLoop((AsioContextManager *)&contextLoop);
        local_50._8_8_ = (pointer)0x0;
        local_38 = std::
                   _Function_handler<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpComms.cpp:177:9)>
                   ::_M_invoke;
        local_40 = std::
                   _Function_handler<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpComms.cpp:177:9)>
                   ::_M_manager;
        local_50._M_unused._M_object = this;
        std::
        function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
        ::operator=(&(server.
                      super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->dataCall,
                    (function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
                     *)&local_50);
        CLI::std::_Function_base::~_Function_base((_Function_base *)&local_50);
        local_70._8_8_ = (pointer)0x0;
        local_58 = std::
                   _Function_handler<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpComms.cpp:182:9)>
                   ::_M_invoke;
        local_60 = std::
                   _Function_handler<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpComms.cpp:182:9)>
                   ::_M_manager;
        local_70._M_unused._M_object = this;
        std::
        function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>::
        operator=(&(server.
                    super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->errorCall,
                  (function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
                   *)&local_70);
        CLI::std::_Function_base::~_Function_base((_Function_base *)&local_70);
        gmlc::networking::TcpServer::start
                  (server.
                   super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        CommsInterface::setRxStatus((CommsInterface *)this,CONNECTED);
        do {
          while( true ) {
            pBVar5 = this_00;
            gmlc::containers::
            BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::pop
                      (&message,this_00);
            iVar4 = (int)pBVar5;
            if (((message.messageAction == cmd_protocol_priority) ||
                (message.messageAction == cmd_protocol_big)) ||
               (message.messageAction == cmd_protocol)) break;
            ActionMessage::~ActionMessage(&message);
          }
          iVar2 = message.messageID;
          ActionMessage::~ActionMessage(&message);
        } while ((iVar2 != 0x9db) && (iVar2 != 0x16570bf));
        LOCK();
        (this->super_NetworkCommsInterface).super_CommsInterface.disconnecting._M_base._M_i = true;
        UNLOCK();
        message.messageAction = cmd_add_publisher;
        message.messageID = 0;
        std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                  ((duration<long,_std::ratio<1L,_1000L>_> *)&message);
        gmlc::networking::TcpServer::close
                  (server.
                   super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,iVar4);
        CommsInterface::setRxStatus((CommsInterface *)this,TERMINATED);
        std::
        unique_ptr<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
        ::~unique_ptr(&contextLoop);
        goto LAB_002667d5;
      }
      if (((this->super_NetworkCommsInterface).autoPortNumber != true) ||
         (((this->super_NetworkCommsInterface).hasBroker._M_base._M_i & 1U) == 0)) break;
      gmlc::networking::TcpServer::close
                (server.super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,(int)timeOut.__r);
      LOCK();
      paVar1 = &(this->super_NetworkCommsInterface).PortNumber;
      (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
      UNLOCK();
      gmlc::networking::TcpServer::create
                ((TcpServer *)&message,(SocketFactory *)local_148,
                 ((ioctx.
                   super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->ictx)._M_t.
                 super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
                 super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl,address,
                 (uint16_t)
                 (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i,
                 this->reuse_address,
                 (this->super_NetworkCommsInterface).super_CommsInterface.maxMessageSize);
      timeOut.__r = (rep)&message;
      std::__shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&server.super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>
                 ,(__shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2> *)&message)
      ;
      CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&message.source_id);
    }
    message_00._M_str = "retrying tcp bind";
    message_00._M_len = 0x11;
    CommsInterface::logWarning((CommsInterface *)this,message_00);
    message.messageAction = cmd_add_interdependency|cmd_user_disconnect;
    message.messageID = 0;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)&message);
    timeOut.__r = (this->super_NetworkCommsInterface).super_CommsInterface.connectionTimeout.__r;
    bVar3 = gmlc::networking::TcpServer::reConnect
                      (server.
                       super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,timeOut);
  } while (bVar3);
  iVar4 = 0x27;
  message_01._M_str = "unable to bind to tcp connection socket";
  message_01._M_len = 0x27;
  CommsInterface::logError((CommsInterface *)this,message_01);
  gmlc::networking::TcpServer::close
            (server.super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,iVar4);
  CommsInterface::setRxStatus((CommsInterface *)this,ERRORED);
LAB_002667d5:
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &server.super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  CLI::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 8));
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &ioctx.
              super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void TcpComms::queue_rx_function()
{
    while (PortNumber < 0) {
        auto message = rxMessageQueue.pop();
        if (isProtocolCommand(message)) {
            switch (message.messageID) {
                case PORT_DEFINITIONS: {
                    loadPortDefinitions(message);
                }

                break;
                case CLOSE_RECEIVER:
                case DISCONNECT:
                    disconnecting = true;
                    setRxStatus(ConnectionStatus::TERMINATED);
                    return;
            }
        }
    }
    if (PortNumber < 0) {
        setRxStatus(ConnectionStatus::ERRORED);
        return;
    }
    auto ioctx = gmlc::networking::AsioContextManager::getContextPointer();
    auto sf = encrypted ? gmlc::networking::SocketFactory(encryption_config) :
                          gmlc::networking::SocketFactory();
    auto server = gmlc::networking::TcpServer::create(sf,
                                                      ioctx->getBaseContext(),
                                                      localTargetAddress,
                                                      static_cast<uint16_t>(PortNumber.load()),
                                                      reuse_address,
                                                      maxMessageSize);
    while (!server->isReady()) {
        if ((autoPortNumber) && (hasBroker)) {  // If we failed and we are on an automatically
                                                // assigned port number, just try a different port
            server->close();
            ++PortNumber;
            server = gmlc::networking::TcpServer::create(sf,
                                                         ioctx->getBaseContext(),
                                                         localTargetAddress,
                                                         static_cast<uint16_t>(PortNumber),
                                                         reuse_address,
                                                         maxMessageSize);
        } else {
            logWarning("retrying tcp bind");
            std::this_thread::sleep_for(std::chrono::milliseconds(150));
            auto connected = server->reConnect(connectionTimeout);
            if (!connected) {
                logError("unable to bind to tcp connection socket");
                server->close();
                setRxStatus(ConnectionStatus::ERRORED);
                return;
            }
        }
    }
    auto contextLoop = ioctx->startContextLoop();
    server->setDataCall(
        [this](const TcpConnection::pointer& connection, const char* data, size_t datasize) {
            return dataReceive(connection.get(), data, datasize);
        });
    CommsInterface* ci = this;
    server->setErrorCall(
        [ci](const TcpConnection::pointer& connection, const std::error_code& error) {
            return commErrorHandler(ci, connection.get(), error);
        });
    server->start();
    setRxStatus(ConnectionStatus::CONNECTED);
    bool loopRunning = true;
    while (loopRunning) {
        auto message = rxMessageQueue.pop();
        if (isProtocolCommand(message)) {
            switch (message.messageID) {
                case CLOSE_RECEIVER:
                case DISCONNECT:
                    loopRunning = false;
                    break;
            }
        }
    }

    disconnecting = true;
    std::this_thread::sleep_for(std::chrono::milliseconds(50));
    server->close();
    setRxStatus(ConnectionStatus::TERMINATED);
}